

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::block_evaluator<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true,_true>::
block_evaluator(block_evaluator<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true,_true> *this,
               XprType *block)

{
  mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
  ::mapbase_evaluator(&this->
                       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                      ,block);
  if (((ulong)(block->
              super_BlockImpl<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true,_Eigen::Dense>).
              super_BlockImpl_dense<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_32,_0,_64,_32>,_64,_1,_true>,_0>.
              m_data & 0xf) == 0) {
    return;
  }
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/CoreEvaluators.h"
                ,0x464,
                "Eigen::internal::block_evaluator<Eigen::Matrix<float, 64, 32>, 64, 1, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<float, 64, 32>, BlockRows = 64, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

block_evaluator(const XprType& block)
    : mapbase_evaluator<XprType, typename XprType::PlainObject>(block) 
  {
    // TODO: for the 3.3 release, this should be turned to an internal assertion, but let's keep it as is for the beta lifetime
    eigen_assert(((internal::UIntPtr(block.data()) % EIGEN_PLAIN_ENUM_MAX(1,evaluator<XprType>::Alignment)) == 0) && "data is not aligned");
  }